

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O3

void __thiscall Camera::initialize(Camera *this,GLFWwindow *window)

{
  glfwSetScrollCallback(window,initialize::anon_class_1_0_00000001::__invoke);
  return;
}

Assistant:

void Camera::initialize(GLFWwindow  * window) {
    // TODO: FIX
    //glfwSetWindowUserPointer(window, this);
    
    auto scroll_callback = [](GLFWwindow * window, double xoffset, double yoffset) {
        ((Camera *)(window))->scroll(xoffset, yoffset);
    };

    glfwSetScrollCallback(
        window,
        scroll_callback
    );
}